

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::IntLoadResidual_F(ChBody *this,uint off,ChVectorDynamic<> *R,double c)

{
  double *pdVar1;
  long *plVar2;
  ulong *puVar3;
  double *pdVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Index index_1;
  long lVar17;
  uint uVar18;
  Index index;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 in_register_00001208 [56];
  ChVector<double> v;
  long in_stack_00000018;
  long in_stack_00000020;
  undefined1 local_18 [16];
  double local_8;
  
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = c;
  lVar17 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
  ;
  if (lVar17 < (long)(ulong)off) goto LAB_00506e0e;
  pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar1 = pdVar4 + off;
  uVar19 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar20 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar20 < 3) {
      uVar19 = (ulong)uVar20;
    }
    if (uVar20 != 0) goto LAB_00506c6b;
  }
  else {
LAB_00506c6b:
    uVar21 = 0;
    do {
      pdVar1[uVar21] = c * (this->Xforce).m_data[uVar21] + pdVar1[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar19 != uVar21);
  }
  if (uVar19 < 3) {
    do {
      pdVar1[uVar19] = c * (this->Xforce).m_data[uVar19] + pdVar1[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar19 != 3);
  }
  if ((this->bflags & 0x800) != 0) {
    if (lVar17 < (long)(ulong)(off + 3)) goto LAB_00506e0e;
    pdVar4 = pdVar4 + (off + 3);
    uVar19 = 3;
    if (((ulong)pdVar4 & 7) == 0) {
      uVar20 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar20 < 3) {
        uVar19 = (ulong)uVar20;
      }
      if (uVar20 == 0) goto LAB_00506de4;
    }
    uVar21 = 0;
    do {
      pdVar4[uVar21] = c * (this->Xtorque).m_data[uVar21] + pdVar4[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar19 != uVar21);
LAB_00506de4:
    if (2 < uVar19) {
      return;
    }
    do {
      pdVar4[uVar19] = c * (this->Xtorque).m_data[uVar19] + pdVar4[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar19 != 3);
    return;
  }
  local_18 = vsubpd_avx(*(undefined1 (*) [16])(this->Xtorque).m_data,
                        *(undefined1 (*) [16])(this->gyro).m_data);
  local_8 = (this->Xtorque).m_data[2] - (this->gyro).m_data[2];
  if (lVar17 < (long)(ulong)(off + 3)) {
LAB_00506e0e:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar4 = pdVar4 + (off + 3);
  uVar20 = 3;
  if (((ulong)pdVar4 & 7) == 0) {
    uVar18 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
    if (uVar18 < 3) {
      uVar20 = uVar18;
    }
    if (uVar18 == 0) goto LAB_00506d52;
  }
  auVar23 = vbroadcastsd_avx512f(auVar23._0_16_);
  auVar24 = vpbroadcastq_avx512f();
  uVar19 = vpcmpuq_avx512f(auVar24,_DAT_00955180,5);
  bVar5 = (byte)uVar19;
  auVar24._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * local_18._8_8_;
  auVar24._0_8_ = (ulong)(bVar5 & 1) * local_18._0_8_;
  auVar24._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * (long)local_8;
  auVar24._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * (long)v.m_data[0];
  auVar24._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * (long)v.m_data[1];
  auVar24._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * (long)v.m_data[2];
  auVar24._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * in_stack_00000018;
  auVar24._56_8_ = (uVar19 >> 7) * in_stack_00000020;
  auVar25._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * (long)pdVar4[1];
  auVar25._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar4;
  auVar25._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * (long)pdVar4[2];
  auVar25._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * (long)pdVar4[3];
  auVar25._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * (long)pdVar4[4];
  auVar25._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * (long)pdVar4[5];
  auVar25._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * (long)pdVar4[6];
  auVar25._56_8_ = (uVar19 >> 7) * (long)pdVar4[7];
  auVar23 = vmulpd_avx512f(auVar24,auVar23);
  auVar23 = vaddpd_avx512f(auVar23,auVar25);
  bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
  bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
  bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
  bVar9 = (bool)((byte)(uVar19 >> 4) & 1);
  bVar10 = (bool)((byte)(uVar19 >> 5) & 1);
  bVar11 = (bool)((byte)(uVar19 >> 6) & 1);
  *pdVar4 = (double)((ulong)(bVar5 & 1) * auVar23._0_8_ | (ulong)!(bool)(bVar5 & 1) * (long)*pdVar4)
  ;
  pdVar4[1] = (double)((ulong)bVar6 * auVar23._8_8_ | (ulong)!bVar6 * (long)pdVar4[1]);
  pdVar4[2] = (double)((ulong)bVar7 * auVar23._16_8_ | (ulong)!bVar7 * (long)pdVar4[2]);
  pdVar4[3] = (double)((ulong)bVar8 * auVar23._24_8_ | (ulong)!bVar8 * (long)pdVar4[3]);
  pdVar4[4] = (double)((ulong)bVar9 * auVar23._32_8_ | (ulong)!bVar9 * (long)pdVar4[4]);
  pdVar4[5] = (double)((ulong)bVar10 * auVar23._40_8_ | (ulong)!bVar10 * (long)pdVar4[5]);
  pdVar4[6] = (double)((ulong)bVar11 * auVar23._48_8_ | (ulong)!bVar11 * (long)pdVar4[6]);
  pdVar4[7] = (double)((uVar19 >> 7) * auVar23._56_8_ |
                      (ulong)!SUB81(uVar19 >> 7,0) * (long)pdVar4[7]);
LAB_00506d52:
  if (uVar20 < 3) {
    uVar21 = (ulong)(uVar20 << 3);
    auVar22 = vpbroadcastq_avx512vl();
    uVar19 = vpcmpuq_avx512vl(auVar22,_DAT_00955380,5);
    uVar19 = uVar19 & 0xf;
    lVar17 = *(long *)(local_18 + uVar21 + 8);
    lVar12 = *(long *)((long)&local_8 + uVar21);
    lVar13 = *(long *)((long)v.m_data + uVar21);
    bVar5 = (byte)uVar19;
    plVar2 = (long *)((long)pdVar4 + uVar21);
    lVar14 = plVar2[1];
    lVar15 = plVar2[2];
    lVar16 = plVar2[3];
    puVar3 = (ulong *)((long)pdVar4 + uVar21);
    bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
    *puVar3 = (ulong)(bVar5 & 1) *
              (long)((double)((ulong)(bVar5 & 1) * *(long *)(local_18 + uVar21)) * c +
                    (double)((ulong)(bVar5 & 1) * *plVar2)) | (ulong)!(bool)(bVar5 & 1) * *puVar3;
    puVar3[1] = (ulong)bVar6 *
                (long)((double)((ulong)((byte)(uVar19 >> 1) & 1) * lVar17) * c +
                      (double)((ulong)((byte)(uVar19 >> 1) & 1) * lVar14)) |
                (ulong)!bVar6 * puVar3[1];
    puVar3[2] = (ulong)bVar7 *
                (long)((double)((ulong)((byte)(uVar19 >> 2) & 1) * lVar12) * c +
                      (double)((ulong)((byte)(uVar19 >> 2) & 1) * lVar15)) |
                (ulong)!bVar7 * puVar3[2];
    puVar3[3] = (uVar19 >> 3) *
                (long)((double)((uVar19 >> 3) * lVar13) * c + (double)((uVar19 >> 3) * lVar16)) |
                (ulong)!SUB81(uVar19 >> 3,0) * puVar3[3];
  }
  return;
}

Assistant:

void ChBody::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                               ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                               const double c           // a scaling factor
) {
    // add applied forces to 'fb' vector
    R.segment(off, 3) += c * Xforce.eigen();

    // add applied torques to 'fb' vector, including gyroscopic torque
    if (this->GetNoGyroTorque())
        R.segment(off + 3, 3) += c * Xtorque.eigen();
    else
        R.segment(off + 3, 3) += c * (Xtorque - gyro).eigen();
}